

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_add_asn1_int64_with_tag(CBB *cbb,int64_t value,CBS_ASN1_TAG tag)

{
  int iVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  uint8_t bytes [8];
  CBB child;
  
  if (-1 < value) {
    iVar1 = CBB_add_asn1_uint64_with_tag(cbb,value,tag);
    return iVar1;
  }
  bytes = (uint8_t  [8])value;
  uVar2 = 7;
  do {
    uVar3 = uVar2;
    if (((int)uVar3 == 0) || (bytes[uVar3] != 0xff)) break;
    uVar2 = (ulong)((int)uVar3 - 1);
  } while ((char)bytes[uVar2] < '\0');
  iVar1 = CBB_add_asn1(cbb,&child,tag);
  if (iVar1 != 0) {
    do {
      if ((int)uVar3 < 0) {
        iVar1 = CBB_flush(cbb);
        return iVar1;
      }
      iVar1 = CBB_add_u8(&child,bytes[uVar3]);
      uVar3 = (ulong)((int)uVar3 - 1);
    } while (iVar1 != 0);
  }
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_add_asn1_int64_with_tag(CBB *cbb, int64_t value, CBS_ASN1_TAG tag) {
  if (value >= 0) {
    return CBB_add_asn1_uint64_with_tag(cbb, (uint64_t)value, tag);
  }

  uint8_t bytes[sizeof(int64_t)];
  memcpy(bytes, &value, sizeof(value));
  int start = 7;
  // Skip leading sign-extension bytes unless they are necessary.
  while (start > 0 && (bytes[start] == 0xff && (bytes[start - 1] & 0x80))) {
    start--;
  }

  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }
  for (int i = start; i >= 0; i--) {
    if (!CBB_add_u8(&child, bytes[i])) {
      goto err;
    }
  }
  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}